

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall PInt::ReadValue(PInt *this,FArchive *ar,void *addr)

{
  anon_union_8_2_3238421f anon_var_0;
  anon_union_8_5_23513183 anon_var_0_1;
  BYTE tag;
  QWORD local_38;
  undefined8 local_30;
  byte local_21;
  
  FArchive::operator<<(ar,&local_21);
  switch(local_21) {
  case 0:
    FArchive::operator<<(ar,(BYTE *)&local_30);
    local_38 = (QWORD)(char)(byte)local_30;
    break;
  case 1:
    FArchive::operator<<(ar,(BYTE *)&local_30);
    local_38 = (QWORD)(byte)local_30;
    break;
  case 2:
    FArchive::operator<<(ar,(WORD *)&local_30);
    local_38 = (QWORD)CONCAT11(local_30._1_1_,(byte)local_30);
    break;
  case 3:
    FArchive::operator<<(ar,(WORD *)&local_30);
    local_38 = (QWORD)CONCAT11(local_30._1_1_,(byte)local_30);
    break;
  case 4:
    FArchive::operator<<(ar,(DWORD *)&local_30);
    local_38 = (QWORD)CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30));
    break;
  case 5:
    FArchive::operator<<(ar,(DWORD *)&local_30);
    local_38 = (QWORD)CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30));
    break;
  case 6:
  case 7:
    FArchive::operator<<(ar,&local_38);
    break;
  case 8:
    local_38 = 0;
    break;
  case 9:
    local_38 = 1;
    break;
  case 10:
    FArchive::operator<<(ar,(float *)&local_30);
    local_38 = (QWORD)(float)CONCAT22(local_30._2_2_,CONCAT11(local_30._1_1_,(byte)local_30));
    break;
  case 0xb:
    FArchive::operator<<(ar,(double *)&local_30);
    local_38 = (QWORD)(double)CONCAT44(local_30._4_4_,
                                       CONCAT22(local_30._2_2_,
                                                CONCAT11(local_30._1_1_,(byte)local_30)));
    break;
  default:
    PType::SkipValue(ar,(uint)local_21);
    return false;
  }
  switch(*(undefined4 *)&this->field_0x24) {
  case 1:
    *(undefined1 *)addr = (undefined1)local_38;
    break;
  case 2:
    *(undefined2 *)addr = (undefined2)local_38;
    break;
  case 4:
    *(undefined4 *)addr = (undefined4)local_38;
    break;
  case 8:
    *(QWORD *)addr = local_38;
  }
  return true;
}

Assistant:

bool PInt::ReadValue(FArchive &ar, void *addr) const
{
	union
	{
		QWORD uval;
		SQWORD sval;
	};
	BYTE tag;
	union
	{
		BYTE val8;
		WORD val16;
		DWORD val32;
		float single;
		double dbl;
	};

	ar << tag;
	switch (tag)
	{
	case VAL_Zero:		uval = 0; break;
	case VAL_One:		uval = 1; break;
	case VAL_Int8:		ar << val8;	sval = (SBYTE)val8;	break;
	case VAL_UInt8:		ar << val8; uval = val8; break;
	case VAL_Int16:		ar << val16; sval = (SWORD)val16; break;
	case VAL_UInt16:	ar << val16; uval = val16; break;
	case VAL_Int32:		ar << val32; sval = (SDWORD)val32; break;
	case VAL_UInt32:	ar << val32; uval = val32; break;
	case VAL_Int64:		ar << sval; break;
	case VAL_UInt64:	ar << uval; break;
	case VAL_Float32:	ar << single; sval = (SQWORD)single; break;
	case VAL_Float64:	ar << dbl; sval = (SQWORD)dbl; break;
	default:			SkipValue(ar, tag); return false;		// Incompatible type
	}
	switch (Size)
	{
	case 1:	*(BYTE *)addr = (BYTE)uval; break;
	case 2: *(WORD *)addr = (WORD)uval; break;
	case 4: *(DWORD *)addr = (DWORD)uval; break;
	case 8: *(QWORD *)addr = uval; break;
	}
	return true;
}